

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int incrVacuumStep(BtShared *pBt,Pgno nFin,Pgno iLastPg,int bCommit)

{
  Pgno PVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  uint uVar6;
  u8 eType;
  MemPage *pFreePg;
  Pgno iFreePg_1;
  Pgno iPtrPage;
  Pgno iFreePg;
  byte local_59;
  MemPage *local_58;
  Pgno local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  Pgno local_3c;
  MemPage *local_38;
  
  PVar1 = 0;
  if (1 < iLastPg) {
    iVar4 = (iLastPg - 2) - (iLastPg - 2) % (pBt->usableSize / 5 + 1);
    PVar1 = iVar4 + (uint)(iVar4 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  if ((PVar1 != iLastPg) && ((uint)sqlite3PendingByte / pBt->pageSize + 1 != iLastPg)) {
    uVar2 = *(uint *)(pBt->pPage1->aData + 0x24);
    if (((uVar2 >> 0x18 == 0 && (uVar2 & 0xff0000) == 0) && (uVar2 & 0xff00) == 0) &&
        (uVar2 & 0xff) == 0) {
      return 0x65;
    }
    iVar4 = ptrmapGet(pBt,iLastPg,&local_59,&local_3c);
    if (iVar4 != 0) {
      return iVar4;
    }
    if (local_59 == 2) {
      if (bCommit == 0) {
        iVar4 = allocateBtreePage(pBt,&local_58,(Pgno *)&local_38,iLastPg,'\x01');
        if (iVar4 != 0) {
          return iVar4;
        }
        if (local_58 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_58->pDbPage);
        }
      }
    }
    else {
      if (local_59 == 1) {
        uVar5 = 0x11459;
LAB_00132eee:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar5,
                    "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
        return 0xb;
      }
      local_4c = nFin;
      iVar4 = btreeGetPage(pBt,iLastPg,&local_58,0);
      if (iVar4 != 0) {
        return iVar4;
      }
      local_48 = (uint)local_59;
      PVar1 = 0;
      if (bCommit == 0) {
        PVar1 = local_4c;
      }
      local_44 = (uint)(byte)((bCommit == 0) * '\x02');
      do {
        uVar2 = pBt->nPage;
        iVar4 = allocateBtreePage(pBt,&local_38,&local_40,PVar1,(u8)local_44);
        if (iVar4 != 0) {
          if (local_58 == (MemPage *)0x0) {
            return iVar4;
          }
          sqlite3PagerUnrefNotNull(local_58->pDbPage);
          return iVar4;
        }
        if (local_38 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_38->pDbPage);
        }
        if (uVar2 < local_40) {
          if (local_58 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(local_58->pDbPage);
          }
          uVar5 = 0x1148d;
          goto LAB_00132eee;
        }
      } while ((bCommit != 0) && (local_4c < local_40));
      iVar4 = relocatePage(pBt,local_58,(u8)local_48,local_3c,local_40,bCommit);
      if (local_58 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_58->pDbPage);
      }
      if (iVar4 != 0) {
        return iVar4;
      }
    }
  }
  if (bCommit != 0) {
    return 0;
  }
  uVar2 = (uint)sqlite3PendingByte / pBt->pageSize;
  uVar6 = iLastPg - 1;
  do {
    if ((-2 - uVar2) + uVar6 != -1) {
      uVar3 = 0;
      if (1 < uVar6) {
        iVar4 = (uVar6 - 2) - (uVar6 - 2) % (pBt->usableSize / 5 + 1);
        uVar3 = iVar4 + (uint)(iVar4 + 1U == uVar2) + 2;
      }
      if (uVar6 != uVar3) {
        pBt->bDoTruncate = '\x01';
        pBt->nPage = uVar6;
        return 0;
      }
    }
    uVar6 = uVar6 - 1;
  } while( true );
}

Assistant:

static int incrVacuumStep(BtShared *pBt, Pgno nFin, Pgno iLastPg, int bCommit){
  Pgno nFreeList;           /* Number of pages still on the free-list */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iLastPg>nFin );

  if( !PTRMAP_ISPAGE(pBt, iLastPg) && iLastPg!=PENDING_BYTE_PAGE(pBt) ){
    u8 eType;
    Pgno iPtrPage;

    nFreeList = get4byte(&pBt->pPage1->aData[36]);
    if( nFreeList==0 ){
      return SQLITE_DONE;
    }

    rc = ptrmapGet(pBt, iLastPg, &eType, &iPtrPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( eType==PTRMAP_ROOTPAGE ){
      return SQLITE_CORRUPT_BKPT;
    }

    if( eType==PTRMAP_FREEPAGE ){
      if( bCommit==0 ){
        /* Remove the page from the files free-list. This is not required
        ** if bCommit is non-zero. In that case, the free-list will be
        ** truncated to zero after this function returns, so it doesn't
        ** matter if it still contains some garbage entries.
        */
        Pgno iFreePg;
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iLastPg, BTALLOC_EXACT);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        assert( iFreePg==iLastPg );
        releasePage(pFreePg);
      }
    } else {
      Pgno iFreePg;             /* Index of free page to move pLastPg to */
      MemPage *pLastPg;
      u8 eMode = BTALLOC_ANY;   /* Mode parameter for allocateBtreePage() */
      Pgno iNear = 0;           /* nearby parameter for allocateBtreePage() */

      rc = btreeGetPage(pBt, iLastPg, &pLastPg, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* If bCommit is zero, this loop runs exactly once and page pLastPg
      ** is swapped with the first free page pulled off the free list.
      **
      ** On the other hand, if bCommit is greater than zero, then keep
      ** looping until a free-page located within the first nFin pages
      ** of the file is found.
      */
      if( bCommit==0 ){
        eMode = BTALLOC_LE;
        iNear = nFin;
      }
      do {
        MemPage *pFreePg;
        Pgno dbSize = btreePagecount(pBt);
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iNear, eMode);
        if( rc!=SQLITE_OK ){
          releasePage(pLastPg);
          return rc;
        }
        releasePage(pFreePg);
        if( iFreePg>dbSize ){
          releasePage(pLastPg);
          return SQLITE_CORRUPT_BKPT;
        }
      }while( bCommit && iFreePg>nFin );
      assert( iFreePg<iLastPg );

      rc = relocatePage(pBt, pLastPg, eType, iPtrPage, iFreePg, bCommit);
      releasePage(pLastPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  if( bCommit==0 ){
    do {
      iLastPg--;
    }while( iLastPg==PENDING_BYTE_PAGE(pBt) || PTRMAP_ISPAGE(pBt, iLastPg) );
    pBt->bDoTruncate = 1;
    pBt->nPage = iLastPg;
  }
  return SQLITE_OK;
}